

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O2

void cpp_client::morph_any(Any *to_morph,Value *val)

{
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var1;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  type pbVar8;
  Ch *pCVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  type piVar10;
  type pdVar11;
  Bad_manipulation *this;
  pointer_____offset_0x10___ *ppuVar12;
  type_info *ptVar13;
  type_info *this_00;
  allocator local_51;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  
  _Var1._M_head_impl =
       (to_morph->data_)._M_t.
       super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
       .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (holder *)0x0) {
    ptVar13 = (type_info *)&void::typeinfo;
  }
  else {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
    ptVar13 = (type_info *)CONCAT44(extraout_var,iVar6);
  }
  this_00 = (type_info *)&void::typeinfo;
  bVar4 = std::type_info::operator==(ptVar13,(type_info *)&void::typeinfo);
  uVar7 = val->flags_;
  if ((uVar7 >> 8 & 1) == 0) {
    if ((uVar7 >> 10 & 1) != 0) {
      _Var1._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var1._M_head_impl == (holder *)0x0) {
        ptVar13 = (type_info *)&void::typeinfo;
      }
      else {
        iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
        ptVar13 = (type_info *)CONCAT44(extraout_var_00,iVar6);
      }
      bVar5 = std::type_info::operator!=(ptVar13,(type_info *)&double::typeinfo);
      if (bVar5) {
        if (bVar4) {
          iVar6 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(val);
          local_50._M_head_impl._0_4_ = iVar6;
          Any::Any<int>((Any *)&local_48,(int *)&local_50);
          goto LAB_001266a6;
        }
        _Var1._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        if (_Var1._M_head_impl == (holder *)0x0) {
          ptVar13 = (type_info *)&void::typeinfo;
        }
        else {
          iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
          ptVar13 = (type_info *)CONCAT44(extraout_var_03,iVar6);
        }
        bVar4 = std::type_info::operator!=(ptVar13,(type_info *)&int::typeinfo);
        if (!bVar4) {
          iVar6 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(val);
          piVar10 = Any::as<int>(to_morph);
          *piVar10 = iVar6;
          return;
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_manipulation::runtime_error(this,"Integer assigned to non-Integer.");
        goto LAB_001269d8;
      }
      uVar7 = val->flags_;
    }
    if ((uVar7 >> 0x14 & 1) == 0) {
      if ((uVar7 >> 9 & 1) == 0) {
        if (uVar7 == 0) {
          local_48._M_dataplus._M_p = (pointer)0x0;
          local_48._M_string_length = 0;
          _Var1._M_head_impl =
               (to_morph->data_)._M_t.
               super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
               ._M_t.
               super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
          if (_Var1._M_head_impl != (holder *)0x0) {
            (*(_Var1._M_head_impl)->_vptr_holder[5])(_Var1._M_head_impl,&local_48);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
          return;
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_response::runtime_error((Bad_response *)this,"Unknown JSON type received in a delta.");
        ppuVar12 = &Bad_response::typeinfo;
        goto LAB_001269df;
      }
      if (bVar4) {
        local_50._M_head_impl =
             (holder *)
             rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetDouble(val);
        Any::Any<double>((Any *)&local_48,(double *)&local_50);
LAB_001266a6:
        _Var3._M_p = local_48._M_dataplus._M_p;
        local_48._M_dataplus._M_p = (pointer)0x0;
        _Var1._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = (holder *)_Var3._M_p
        ;
        if ((_Var1._M_head_impl != (holder *)0x0) &&
           ((*(_Var1._M_head_impl)->_vptr_holder[1])(),
           (long *)local_48._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
        }
        return;
      }
      _Var1._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var1._M_head_impl == (holder *)0x0) {
        ptVar13 = (type_info *)&void::typeinfo;
      }
      else {
        iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
        ptVar13 = (type_info *)CONCAT44(extraout_var_04,iVar6);
      }
      bVar4 = std::type_info::operator!=(ptVar13,(type_info *)&double::typeinfo);
      if (!bVar4) {
        local_28 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble(val);
        pdVar11 = Any::as<double>(to_morph);
        *pdVar11 = local_28;
        return;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"Double assigned to non-double.");
    }
    else {
      if (bVar4) {
        pCVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_48,pCVar9,&local_51);
        Any::Any<std::__cxx11::string>((Any *)&local_50,&local_48);
        _Var2._M_head_impl = local_50._M_head_impl;
        local_50._M_head_impl = (holder *)0x0;
        _Var1._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var2._M_head_impl;
        if ((_Var1._M_head_impl != (holder *)0x0) &&
           ((*(_Var1._M_head_impl)->_vptr_holder[1])(), local_50._M_head_impl != (holder *)0x0)) {
          (*(local_50._M_head_impl)->_vptr_holder[1])();
        }
        local_50._M_head_impl = (holder *)0x0;
LAB_001268c9:
        std::__cxx11::string::~string((string *)&local_48);
        return;
      }
      _Var1._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var1._M_head_impl == (holder *)0x0) {
        ptVar13 = (type_info *)&void::typeinfo;
      }
      else {
        iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
        ptVar13 = (type_info *)CONCAT44(extraout_var_02,iVar6);
      }
      bVar4 = std::type_info::operator!=(ptVar13,(type_info *)&std::__cxx11::string::typeinfo);
      if (!bVar4) {
        pCVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_48,pCVar9,(allocator *)&local_50);
        iVar6 = (*((to_morph->data_)._M_t.
                   super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                   .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl)->
                  _vptr_holder[3])();
        std::__cxx11::string::operator=
                  ((string *)CONCAT44(extraout_var_05,iVar6),(string *)&local_48);
        goto LAB_001268c9;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"String assigned to non-string.");
    }
  }
  else {
    if (bVar4) {
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(val);
      local_50._M_head_impl._0_1_ = bVar4;
      Any::Any<bool>((Any *)&local_48,(bool *)&local_50);
      goto LAB_001266a6;
    }
    _Var1._M_head_impl =
         (to_morph->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (holder *)0x0) {
      iVar6 = (*(_Var1._M_head_impl)->_vptr_holder[2])();
      this_00 = (type_info *)CONCAT44(extraout_var_01,iVar6);
    }
    bVar4 = std::type_info::operator!=(this_00,(type_info *)&bool::typeinfo);
    if (!bVar4) {
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(val);
      pbVar8 = Any::as<bool>(to_morph);
      *pbVar8 = bVar4;
      return;
    }
    this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
    Bad_manipulation::runtime_error(this,"Boolean assigned to non-Boolean.");
  }
LAB_001269d8:
  ppuVar12 = &Bad_manipulation::typeinfo;
LAB_001269df:
  __cxa_throw(this,ppuVar12,std::runtime_error::~runtime_error);
}

Assistant:

void morph_any(Any& to_morph, const rapidjson::Value& val)
{
   const bool no_type = (to_morph.type() == typeid(void));
   //otherwise just create the Any from it via this stupid if-else block
   if(val.IsBool())
   {
      if(!no_type && to_morph.type() != typeid(bool))
      {
         throw Bad_manipulation("Boolean assigned to non-Boolean.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetBool()};
      }
      else
      {
         to_morph.as<bool>() = val.GetBool();
      }
   }
   else if(val.IsInt() && to_morph.type() != typeid(double))
   {
      if(!no_type && to_morph.type() != typeid(int))
      {
         throw Bad_manipulation("Integer assigned to non-Integer.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetInt()};
      }
      else
      {
         to_morph.as<int>() = val.GetInt();
      }
   }
   else if(val.IsString())
   {
      if(!no_type && to_morph.type() != typeid(std::string))
      {
         throw Bad_manipulation("String assigned to non-string.");
      }
      if(no_type)
      {
         to_morph = Any{std::string{val.GetString()}};
      }
      else
      {
         to_morph.as<std::string>() = std::string{val.GetString()};
      }
   }
   else if(val.IsNumber())
   {
      if(!no_type && to_morph.type() != typeid(double))
      {
         throw Bad_manipulation("Double assigned to non-double.");
      }
      if(no_type)
      {
         to_morph = Any{static_cast<double>(val.GetDouble())};
      }
      else
      {
         to_morph.as<double>() = static_cast<double>(val.GetDouble());
      }
   }
   else if(val.IsNull())
   {
      to_morph.reset();
   }
   else
   {
      //some kind of weird gross type that's icky
      throw Bad_response("Unknown JSON type received in a delta.");
   }
}